

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_avx2_256_8.c
# Opt level: O2

parasail_result_t *
parasail_nw_striped_profile_avx2_256_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i alVar1;
  void *pvVar2;
  parasail_matrix_t *ppVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  char cVar6;
  int8_t iVar7;
  int iVar8;
  int iVar9;
  parasail_result_t *ppVar10;
  __m256i *ptr;
  __m256i *palVar11;
  __m256i *ptr_00;
  int8_t *ptr_01;
  long lVar12;
  char *pcVar13;
  char cVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  char *__format;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  ulong size;
  __m256i *palVar23;
  undefined1 uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  __m256i_8_t e;
  __m256i_8_t h;
  longlong local_a0;
  longlong lStack_98;
  longlong lStack_90;
  longlong lStack_88;
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  undefined1 auVar26 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar13 = "profile";
  }
  else {
    pvVar2 = (profile->profile8).score;
    if (pvVar2 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar13 = "profile->profile8.score";
    }
    else {
      ppVar3 = profile->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar13 = "profile->matrix";
      }
      else {
        uVar17 = profile->s1Len;
        if ((int)uVar17 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar13 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar13 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar13 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar13 = "open";
        }
        else {
          if (-1 < gap) {
            uVar16 = uVar17 - 1;
            size = (ulong)uVar17 + 0x1f >> 5;
            iVar8 = ppVar3->min;
            iVar22 = -open;
            uVar17 = (uint)(byte)-(char)iVar8;
            if (iVar8 != iVar22 && SBORROW4(iVar8,iVar22) == iVar8 + open < 0) {
              uVar17 = open;
            }
            cVar6 = '~' - (char)ppVar3->max;
            ppVar10 = parasail_result_new();
            if (ppVar10 != (parasail_result_t *)0x0) {
              ppVar10->flag = ppVar10->flag | 0x20100801;
              ptr = parasail_memalign___m256i(0x20,size);
              palVar11 = parasail_memalign___m256i(0x20,size);
              ptr_00 = parasail_memalign___m256i(0x20,size);
              ptr_01 = parasail_memalign_int8_t(0x20,(ulong)(s2Len + 1));
              if ((ptr_01 != (int8_t *)0x0 && ptr_00 != (__m256i *)0x0) &&
                  (palVar11 != (__m256i *)0x0 && ptr != (__m256i *)0x0)) {
                iVar8 = s2Len + -1;
                uVar24 = (undefined1)open;
                auVar28[1] = uVar24;
                auVar28[0] = uVar24;
                auVar28[2] = uVar24;
                auVar28[3] = uVar24;
                auVar28[4] = uVar24;
                auVar28[5] = uVar24;
                auVar28[6] = uVar24;
                auVar28[7] = uVar24;
                auVar28[8] = uVar24;
                auVar28[9] = uVar24;
                auVar28[10] = uVar24;
                auVar28[0xb] = uVar24;
                auVar28[0xc] = uVar24;
                auVar28[0xd] = uVar24;
                auVar28[0xe] = uVar24;
                auVar28[0xf] = uVar24;
                auVar28[0x10] = uVar24;
                auVar28[0x11] = uVar24;
                auVar28[0x12] = uVar24;
                auVar28[0x13] = uVar24;
                auVar28[0x14] = uVar24;
                auVar28[0x15] = uVar24;
                auVar28[0x16] = uVar24;
                auVar28[0x17] = uVar24;
                auVar28[0x18] = uVar24;
                auVar28[0x19] = uVar24;
                auVar28[0x1a] = uVar24;
                auVar28[0x1b] = uVar24;
                auVar28[0x1c] = uVar24;
                auVar28[0x1d] = uVar24;
                auVar28[0x1e] = uVar24;
                auVar28[0x1f] = uVar24;
                uVar24 = (undefined1)gap;
                auVar29[1] = uVar24;
                auVar29[0] = uVar24;
                auVar29[2] = uVar24;
                auVar29[3] = uVar24;
                auVar29[4] = uVar24;
                auVar29[5] = uVar24;
                auVar29[6] = uVar24;
                auVar29[7] = uVar24;
                auVar29[8] = uVar24;
                auVar29[9] = uVar24;
                auVar29[10] = uVar24;
                auVar29[0xb] = uVar24;
                auVar29[0xc] = uVar24;
                auVar29[0xd] = uVar24;
                auVar29[0xe] = uVar24;
                auVar29[0xf] = uVar24;
                auVar29[0x10] = uVar24;
                auVar29[0x11] = uVar24;
                auVar29[0x12] = uVar24;
                auVar29[0x13] = uVar24;
                auVar29[0x14] = uVar24;
                auVar29[0x15] = uVar24;
                auVar29[0x16] = uVar24;
                auVar29[0x17] = uVar24;
                auVar29[0x18] = uVar24;
                auVar29[0x19] = uVar24;
                auVar29[0x1a] = uVar24;
                auVar29[0x1b] = uVar24;
                auVar29[0x1c] = uVar24;
                auVar29[0x1d] = uVar24;
                auVar29[0x1e] = uVar24;
                auVar29[0x1f] = uVar24;
                cVar14 = (char)uVar17 + -0x7f;
                auVar25[1] = cVar14;
                auVar25[0] = cVar14;
                auVar25[2] = cVar14;
                auVar25[3] = cVar14;
                auVar25[4] = cVar14;
                auVar25[5] = cVar14;
                auVar25[6] = cVar14;
                auVar25[7] = cVar14;
                auVar25[8] = cVar14;
                auVar25[9] = cVar14;
                auVar25[10] = cVar14;
                auVar25[0xb] = cVar14;
                auVar25[0xc] = cVar14;
                auVar25[0xd] = cVar14;
                auVar25[0xe] = cVar14;
                auVar25[0xf] = cVar14;
                auVar26[0x10] = cVar14;
                auVar26._0_16_ = auVar25;
                auVar26[0x11] = cVar14;
                auVar26[0x12] = cVar14;
                auVar26[0x13] = cVar14;
                auVar26[0x14] = cVar14;
                auVar26[0x15] = cVar14;
                auVar26[0x16] = cVar14;
                auVar26[0x17] = cVar14;
                auVar26[0x18] = cVar14;
                auVar26[0x19] = cVar14;
                auVar26[0x1a] = cVar14;
                auVar26[0x1b] = cVar14;
                auVar26[0x1c] = cVar14;
                auVar26[0x1d] = cVar14;
                auVar26[0x1e] = cVar14;
                auVar26[0x1f] = cVar14;
                auVar27[1] = cVar6;
                auVar27[0] = cVar6;
                auVar27[2] = cVar6;
                auVar27[3] = cVar6;
                auVar27[4] = cVar6;
                auVar27[5] = cVar6;
                auVar27[6] = cVar6;
                auVar27[7] = cVar6;
                auVar27[8] = cVar6;
                auVar27[9] = cVar6;
                auVar27[10] = cVar6;
                auVar27[0xb] = cVar6;
                auVar27[0xc] = cVar6;
                auVar27[0xd] = cVar6;
                auVar27[0xe] = cVar6;
                auVar27[0xf] = cVar6;
                auVar27[0x10] = cVar6;
                auVar27[0x11] = cVar6;
                auVar27[0x12] = cVar6;
                auVar27[0x13] = cVar6;
                auVar27[0x14] = cVar6;
                auVar27[0x15] = cVar6;
                auVar27[0x16] = cVar6;
                auVar27[0x17] = cVar6;
                auVar27[0x18] = cVar6;
                auVar27[0x19] = cVar6;
                auVar27[0x1a] = cVar6;
                auVar27[0x1b] = cVar6;
                auVar27[0x1c] = cVar6;
                auVar27[0x1d] = cVar6;
                auVar27[0x1e] = cVar6;
                auVar27[0x1f] = cVar6;
                lVar19 = (long)iVar22;
                for (uVar20 = 0; uVar20 != size; uVar20 = uVar20 + 1) {
                  lVar12 = lVar19;
                  for (lVar15 = 0; lVar15 != 0x20; lVar15 = lVar15 + 1) {
                    lVar21 = -0x80;
                    if (-0x80 < lVar12) {
                      lVar21 = lVar12;
                    }
                    lVar18 = lVar12 - (ulong)(uint)open;
                    if ((long)(lVar12 - (ulong)(uint)open) < -0x7f) {
                      lVar18 = -0x80;
                    }
                    *(char *)((long)&local_80 + lVar15) = (char)lVar21;
                    *(char *)((long)&local_a0 + lVar15) = (char)lVar18;
                    lVar12 = lVar12 - size * (uint)gap;
                  }
                  palVar23 = ptr + uVar20;
                  (*palVar23)[0] = local_80;
                  (*palVar23)[1] = lStack_78;
                  (*palVar23)[2] = lStack_70;
                  (*palVar23)[3] = lStack_68;
                  palVar23 = ptr_00 + uVar20;
                  (*palVar23)[0] = local_a0;
                  (*palVar23)[1] = lStack_98;
                  (*palVar23)[2] = lStack_90;
                  (*palVar23)[3] = lStack_88;
                  lVar19 = lVar19 - (ulong)(uint)gap;
                }
                *ptr_01 = '\0';
                for (uVar20 = 1; s2Len + 1 != uVar20; uVar20 = uVar20 + 1) {
                  iVar7 = -0x80;
                  if (-0x80 < iVar22) {
                    iVar7 = (int8_t)iVar22;
                  }
                  ptr_01[uVar20] = iVar7;
                  iVar22 = iVar22 - gap;
                }
                uVar20 = 0;
                auVar31 = ZEXT3264(auVar27);
                auVar30 = ZEXT3264(auVar26);
                do {
                  palVar23 = palVar11;
                  if (uVar20 == (uint)s2Len) {
                    alVar1 = ptr[(ulong)uVar16 % size];
                    for (iVar22 = 0; iVar22 < 0x1f - (int)(uVar16 / size); iVar22 = iVar22 + 1) {
                      auVar28 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,
                                                0x28);
                      alVar1 = (__m256i)vpalignr_avx2((undefined1  [32])alVar1,auVar28,0xf);
                    }
                    auVar26 = vpcmpgtb_avx2(auVar26,auVar31._0_32_);
                    auVar27 = vpcmpgtb_avx2(auVar30._0_32_,auVar27);
                    auVar26 = vpor_avx2(auVar27,auVar26);
                    if ((((((((((((((((((((((((((((((((auVar26 >> 7 & (undefined1  [32])0x1) ==
                                                      (undefined1  [32])0x0 &&
                                                     (auVar26 >> 0xf & (undefined1  [32])0x1) ==
                                                     (undefined1  [32])0x0) &&
                                                    (auVar26 >> 0x17 & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0) &&
                                                   (auVar26 >> 0x1f & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar26 >> 0x27 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 (auVar26 >> 0x2f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar26 >> 0x37 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar26 >> 0x3f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar26 >> 0x47 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar26 >> 0x4f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar26 >> 0x57 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar26 >> 0x5f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar26 >> 0x67 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar26 >> 0x6f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar26 >> 0x77 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) && SUB321(auVar26 >> 0x7f,0) == '\0')
                                      && (auVar26 >> 0x87 & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                     (auVar26 >> 0x8f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar26 >> 0x97 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar26 >> 0x9f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar26 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar26 >> 0xaf & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar26 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar26 >> 0xbf,0) == '\0') &&
                              (auVar26 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                             (auVar26 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar26 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar26 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar26 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar26 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar26 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        -1 < auVar26[0x1f]) {
                      cVar6 = alVar1[2]._7_1_;
                    }
                    else {
                      *(byte *)&ppVar10->flag = (byte)ppVar10->flag | 0x40;
                      cVar6 = '\0';
                      iVar8 = 0;
                      uVar16 = 0;
                    }
                    ppVar10->score = (int)cVar6;
                    ppVar10->end_query = uVar16;
                    ppVar10->end_ref = iVar8;
                    parasail_free(ptr_01);
                    parasail_free(ptr_00);
                    parasail_free(palVar23);
                    parasail_free(ptr);
                    return ppVar10;
                  }
                  auVar32 = SUB3216(ptr[(int)size - 1],0);
                  auVar33._0_16_ = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar25;
                  auVar33._16_16_ = ZEXT116(0) * auVar26._16_16_ + ZEXT116(1) * auVar32;
                  auVar33 = vpalignr_avx2((undefined1  [32])ptr[(int)size - 1],auVar33,0xf);
                  iVar22 = ppVar3->mapper[(byte)s2[uVar20]];
                  auVar32 = vpinsrb_avx(auVar33._0_16_,(uint)(byte)ptr_01[uVar20],0);
                  auVar33 = vpblendd_avx2(auVar33,ZEXT1632(auVar32),0xf);
                  auVar5 = auVar26;
                  for (lVar19 = 0; size * 0x20 != lVar19; lVar19 = lVar19 + 0x20) {
                    auVar34 = vpaddsb_avx2(auVar33,*(undefined1 (*) [32])
                                                    ((long)pvVar2 +
                                                    lVar19 + (long)(iVar22 * (int)size) * 0x20));
                    auVar33 = *(undefined1 (*) [32])((long)*ptr_00 + lVar19);
                    auVar4 = vpmaxsb_avx2(auVar33,auVar5);
                    auVar34 = vpmaxsb_avx2(auVar34,auVar4);
                    *(undefined1 (*) [32])((long)*palVar23 + lVar19) = auVar34;
                    auVar4 = vpmaxsb_avx2(auVar30._0_32_,auVar34);
                    auVar30 = ZEXT3264(auVar4);
                    auVar4 = vpminsb_avx2(auVar31._0_32_,auVar33);
                    auVar4 = vpminsb_avx2(auVar4,auVar5);
                    auVar4 = vpminsb_avx2(auVar4,auVar34);
                    auVar31 = ZEXT3264(auVar4);
                    auVar34 = vpsubsb_avx2(auVar34,auVar28);
                    auVar33 = vpsubsb_avx2(auVar33,auVar29);
                    auVar33 = vpmaxsb_avx2(auVar33,auVar34);
                    *(undefined1 (*) [32])((long)*ptr_00 + lVar19) = auVar33;
                    auVar33 = vpsubsb_avx2(auVar5,auVar29);
                    auVar5 = vpmaxsb_avx2(auVar33,auVar34);
                    auVar33 = *(undefined1 (*) [32])((long)*ptr + lVar19);
                  }
                  for (iVar22 = 0; iVar22 != 0x20; iVar22 = iVar22 + 1) {
                    iVar9 = ptr_01[uVar20 + 1] - open;
                    if (iVar9 < -0x7f) {
                      iVar9 = -0x80;
                    }
                    auVar34._0_16_ = ZEXT116(0) * auVar5._0_16_ + ZEXT116(1) * auVar25;
                    auVar34._16_16_ = ZEXT116(0) * auVar26._16_16_ + ZEXT116(1) * auVar5._0_16_;
                    auVar33 = vpalignr_avx2(auVar5,auVar34,0xf);
                    auVar32 = vpinsrb_avx(auVar33._0_16_,iVar9,0);
                    auVar5 = vpblendd_avx2(auVar33,ZEXT1632(auVar32),0xf);
                    lVar19 = 0;
                    while (size * 0x20 + 0x20 != lVar19 + 0x20) {
                      auVar33 = vpmaxsb_avx2(auVar5,*(undefined1 (*) [32])((long)*palVar23 + lVar19)
                                            );
                      *(undefined1 (*) [32])((long)*palVar23 + lVar19) = auVar33;
                      auVar34 = vpminsb_avx2(auVar31._0_32_,auVar33);
                      auVar31 = ZEXT3264(auVar34);
                      auVar34 = vpmaxsb_avx2(auVar30._0_32_,auVar33);
                      auVar30 = ZEXT3264(auVar34);
                      auVar33 = vpsubsb_avx2(auVar33,auVar28);
                      auVar5 = vpsubsb_avx2(auVar5,auVar29);
                      auVar33 = vpcmpgtb_avx2(auVar5,auVar33);
                      lVar19 = lVar19 + 0x20;
                      if ((((((((((((((((((((((((((((((((auVar33 >> 7 & (undefined1  [32])0x1) ==
                                                        (undefined1  [32])0x0 &&
                                                       (auVar33 >> 0xf & (undefined1  [32])0x1) ==
                                                       (undefined1  [32])0x0) &&
                                                      (auVar33 >> 0x17 & (undefined1  [32])0x1) ==
                                                      (undefined1  [32])0x0) &&
                                                     (auVar33 >> 0x1f & (undefined1  [32])0x1) ==
                                                     (undefined1  [32])0x0) &&
                                                    (auVar33 >> 0x27 & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0) &&
                                                   (auVar33 >> 0x2f & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar33 >> 0x37 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 (auVar33 >> 0x3f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar33 >> 0x47 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar33 >> 0x4f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar33 >> 0x57 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar33 >> 0x5f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar33 >> 0x67 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar33 >> 0x6f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar33 >> 0x77 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar33 >> 0x7f,0) == '\0') &&
                                        (auVar33 >> 0x87 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar33 >> 0x8f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar33 >> 0x97 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar33 >> 0x9f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar33 >> 0xa7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar33 >> 0xaf & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar33 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && SUB321(auVar33 >> 0xbf,0) == '\0') &&
                                (auVar33 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar33 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar33 >> 0xd7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar33 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar33 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar33 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar33 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          -1 < auVar33[0x1f]) goto LAB_0071d2c8;
                    }
                  }
LAB_0071d2c8:
                  uVar20 = uVar20 + 1;
                  palVar11 = ptr;
                  ptr = palVar23;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar13 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_striped_profile_avx2_256_8",pcVar13);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvE = NULL;
    int8_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    int8_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 32; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m256i*)profile->profile8.score;
    vGapO = _mm256_set1_epi8(open);
    vGapE = _mm256_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_32;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad  = parasail_memalign___m256i(32, segLen);
    pvE      = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int8_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_8_t h;
            __m256i_8_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m256i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m256i vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 1);

        /* Correct part of the vProfile */
        const __m256i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m256i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm256_insert_epi8_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_adds_epi8(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi8(vH, vE);
            vH = _mm256_max_epi8(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm256_subs_epi8(vH, vGapO);
            vE = _mm256_subs_epi8(vE, vGapE);
            vE = _mm256_max_epi8(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_subs_epi8(vF, vGapE);
            vF = _mm256_max_epi8(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int8_t tmp2 = tmp < INT8_MIN ? INT8_MIN : tmp;
            vF = _mm256_slli_si256_rpl(vF, 1);
            vF = _mm256_insert_epi8_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi8(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm256_subs_epi8(vH, vGapO);
                vF = _mm256_subs_epi8(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi8(vF, vH))) goto end;
                /*vF = _mm256_max_epi8(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm256_extract_epi8_rpl (vH, 31);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl (vH, 1);
        }
        score = (int8_t) _mm256_extract_epi8_rpl (vH, 31);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi8_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}